

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  StkId pTVar2;
  int iVar3;
  char *pcVar4;
  char *__s;
  lua_Integer lVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char *__n;
  size_t __n_00;
  bool bVar11;
  size_t l2;
  size_t l1;
  MatchState ms;
  
  pcVar4 = luaL_checklstring(L,1,&l1);
  __s = luaL_checklstring(L,2,&l2);
  lVar5 = luaL_optinteger(L,3,1);
  lVar8 = (lVar5 >> 0x3f & l1 + 1) + lVar5;
  lVar9 = 0;
  if (0 < lVar8) {
    lVar9 = lVar8;
  }
  uVar10 = lVar9 - 1U;
  if (l1 <= lVar9 - 1U) {
    uVar10 = l1;
  }
  if (lVar8 < 1) {
    uVar10 = 0;
  }
  if ((find == 0) ||
     ((iVar3 = lua_toboolean(L,4), iVar3 == 0 &&
      (pcVar6 = strpbrk(__s,"^$*+?.([%-"), pcVar6 != (char *)0x0)))) {
    cVar1 = *__s;
    ms.src_end = pcVar4 + l1;
    pcVar6 = pcVar4 + uVar10;
    ms.src_init = pcVar4;
    ms.L = L;
    do {
      uVar10 = uVar10 + 1;
      ms.level = 0;
      pcVar7 = match(&ms,pcVar6,__s + (cVar1 == '^'));
      if (pcVar7 != (char *)0x0) {
        if (find != 0) {
          pTVar2 = L->top;
          (pTVar2->value).n = (double)(long)uVar10;
          pTVar2->tt = 3;
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pTVar2[1].value.n = (double)((long)pcVar7 - (long)pcVar4);
          pTVar2[1].tt = 3;
          L->top = L->top + 1;
          iVar3 = push_captures(&ms,(char *)0x0,(char *)0x0);
          return iVar3 + 2;
        }
        iVar3 = push_captures(&ms,pcVar6,pcVar7);
        return iVar3;
      }
    } while ((cVar1 != '^') && (bVar11 = pcVar6 < ms.src_end, pcVar6 = pcVar6 + 1, bVar11));
  }
  else {
    pcVar6 = pcVar4 + uVar10;
    if (l2 == 0) {
      if (pcVar4 != (char *)0x0) {
LAB_00110aa1:
        pTVar2 = L->top;
        (pTVar2->value).n = (double)(long)(pcVar6 + (1 - (long)pcVar4));
        pTVar2->tt = 3;
        pTVar2 = L->top;
        L->top = pTVar2 + 1;
        pTVar2[1].value.n = (double)(long)(pcVar6 + (l2 - (long)pcVar4));
        pTVar2[1].tt = 3;
        L->top = L->top + 1;
        return 2;
      }
    }
    else if (l2 <= l1 - uVar10) {
      __n_00 = l2 - 1;
      __n = (char *)((l1 - uVar10) - __n_00);
      pcVar7 = pcVar6;
      while ((__n != (char *)0x0 &&
             (pcVar6 = (char *)memchr(pcVar7,(int)*__s,(size_t)__n), pcVar6 != (char *)0x0))) {
        __s1 = pcVar6 + 1;
        iVar3 = bcmp(__s1,__s + 1,__n_00);
        if (iVar3 == 0) goto LAB_00110aa1;
        __n = pcVar7 + ((long)__n - (long)__s1);
        pcVar7 = __s1;
      }
    }
  }
  pTVar2 = L->top;
  pTVar2->tt = 0;
  L->top = pTVar2 + 1;
  return 1;
}

Assistant:

static int str_find_aux(lua_State*L,int find){
size_t l1,l2;
const char*s=luaL_checklstring(L,1,&l1);
const char*p=luaL_checklstring(L,2,&l2);
ptrdiff_t init=posrelat(luaL_optinteger(L,3,1),l1)-1;
if(init<0)init=0;
else if((size_t)(init)>l1)init=(ptrdiff_t)l1;
if(find&&(lua_toboolean(L,4)||
strpbrk(p,"^$*+?.([%-")==NULL)){
const char*s2=lmemfind(s+init,l1-init,p,l2);
if(s2){
lua_pushinteger(L,s2-s+1);
lua_pushinteger(L,s2-s+l2);
return 2;
}
}
else{
MatchState ms;
int anchor=(*p=='^')?(p++,1):0;
const char*s1=s+init;
ms.L=L;
ms.src_init=s;
ms.src_end=s+l1;
do{
const char*res;
ms.level=0;
if((res=match(&ms,s1,p))!=NULL){
if(find){
lua_pushinteger(L,s1-s+1);
lua_pushinteger(L,res-s);
return push_captures(&ms,NULL,0)+2;
}
else
return push_captures(&ms,s1,res);
}
}while(s1++<ms.src_end&&!anchor);
}
lua_pushnil(L);
return 1;
}